

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void * sqlite3Fts3HashInsert(Fts3Hash *pH,void *pKey,int nKey,void *data)

{
  _fts3ht *p_Var1;
  Fts3HashElem *pFVar2;
  int iVar3;
  int iVar4;
  Fts3HashElem *pFVar5;
  void *pvVar6;
  Fts3HashElem *pFVar7;
  code *pcVar8;
  ulong uVar9;
  
  pcVar8 = fts3BinHash;
  if (pH->keyClass == '\x01') {
    pcVar8 = fts3StrHash;
  }
  iVar3 = (*pcVar8)(pKey,nKey);
  uVar9 = (long)pH->htsize - 1U & (long)iVar3;
  pFVar5 = fts3FindElementByHash(pH,pKey,nKey,(int)uVar9);
  if (pFVar5 == (Fts3HashElem *)0x0) {
    if (data != (void *)0x0) {
      if (((pH->htsize == 0) && (iVar4 = fts3Rehash(pH,8), iVar4 != 0)) ||
         ((pH->htsize <= pH->count && (iVar4 = fts3Rehash(pH,pH->htsize * 2), iVar4 != 0)))) {
        pH->count = 0;
        return data;
      }
      pFVar5 = (Fts3HashElem *)fts3HashMalloc(0x28);
      if (pFVar5 == (Fts3HashElem *)0x0) {
        return data;
      }
      if ((pKey == (void *)0x0) || (pH->copyKey == '\0')) {
        pFVar5->pKey = pKey;
      }
      else {
        pvVar6 = fts3HashMalloc((long)nKey);
        pFVar5->pKey = pvVar6;
        if (pvVar6 == (void *)0x0) {
          sqlite3_free(pFVar5);
          return data;
        }
        memcpy(pvVar6,pKey,(long)nKey);
      }
      pFVar5->nKey = nKey;
      pH->count = pH->count + 1;
      fts3HashInsertElement(pH,pH->ht + ((long)pH->htsize - 1U & (long)iVar3),pFVar5);
      pFVar5->data = data;
    }
    return (void *)0x0;
  }
  pvVar6 = pFVar5->data;
  if (data != (void *)0x0) {
    pFVar5->data = data;
    return pvVar6;
  }
  pFVar2 = pFVar5->prev;
  pFVar7 = (Fts3HashElem *)&pH->first;
  if (pFVar2 != (Fts3HashElem *)0x0) {
    pFVar7 = pFVar2;
  }
  pFVar7->next = pFVar5->next;
  pFVar7 = pFVar5->next;
  if (pFVar7 != (Fts3HashElem *)0x0) {
    pFVar7->prev = pFVar2;
  }
  p_Var1 = pH->ht + uVar9;
  if (pH->ht[uVar9].chain == pFVar5) {
    p_Var1->chain = pFVar7;
  }
  iVar3 = p_Var1->count;
  p_Var1->count = iVar3 + -1;
  if (iVar3 < 2) {
    p_Var1->chain = (Fts3HashElem *)0x0;
  }
  if ((pH->copyKey != '\0') && (pFVar5->pKey != (void *)0x0)) {
    sqlite3_free(pFVar5->pKey);
  }
  sqlite3_free(pFVar5);
  iVar3 = pH->count;
  pH->count = iVar3 + -1;
  if (1 < iVar3) {
    return pvVar6;
  }
  sqlite3Fts3HashClear(pH);
  return pvVar6;
}

Assistant:

SQLITE_PRIVATE void *sqlite3Fts3HashInsert(
  Fts3Hash *pH,        /* The hash table to insert into */
  const void *pKey,    /* The key */
  int nKey,            /* Number of bytes in the key */
  void *data           /* The data */
){
  int hraw;                 /* Raw hash value of the key */
  int h;                    /* the hash of the key modulo hash table size */
  Fts3HashElem *elem;       /* Used to loop thru the element list */
  Fts3HashElem *new_elem;   /* New element added to the pH */
  int (*xHash)(const void*,int);  /* The hash function */

  assert( pH!=0 );
  xHash = ftsHashFunction(pH->keyClass);
  assert( xHash!=0 );
  hraw = (*xHash)(pKey, nKey);
  assert( (pH->htsize & (pH->htsize-1))==0 );
  h = hraw & (pH->htsize-1);
  elem = fts3FindElementByHash(pH,pKey,nKey,h);
  if( elem ){
    void *old_data = elem->data;
    if( data==0 ){
      fts3RemoveElementByHash(pH,elem,h);
    }else{
      elem->data = data;
    }
    return old_data;
  }
  if( data==0 ) return 0;
  if( (pH->htsize==0 && fts3Rehash(pH,8))
   || (pH->count>=pH->htsize && fts3Rehash(pH, pH->htsize*2))
  ){
    pH->count = 0;
    return data;
  }
  assert( pH->htsize>0 );
  new_elem = (Fts3HashElem*)fts3HashMalloc( sizeof(Fts3HashElem) );
  if( new_elem==0 ) return data;
  if( pH->copyKey && pKey!=0 ){
    new_elem->pKey = fts3HashMalloc( nKey );
    if( new_elem->pKey==0 ){
      fts3HashFree(new_elem);
      return data;
    }
    memcpy((void*)new_elem->pKey, pKey, nKey);
  }else{
    new_elem->pKey = (void*)pKey;
  }
  new_elem->nKey = nKey;
  pH->count++;
  assert( pH->htsize>0 );
  assert( (pH->htsize & (pH->htsize-1))==0 );
  h = hraw & (pH->htsize-1);
  fts3HashInsertElement(pH, &pH->ht[h], new_elem);
  new_elem->data = data;
  return 0;
}